

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSTLUtil.hpp
# Opt level: O3

mapped_type *
de::
lookup<std::map<deqp::gls::FboUtil::ImageFormat,std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<std::pair<deqp::gls::FboUtil::ImageFormat_const,std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>>>>>>
          (map<deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>_>_>_>
           *map,key_type *key)

{
  const_iterator cVar1;
  out_of_range *this;
  
  cVar1 = std::
          _Rb_tree<deqp::gls::FboUtil::ImageFormat,_std::pair<const_deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>_>,_std::_Select1st<std::pair<const_deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>_>_>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<std::pair<const_deqp::gls::FboUtil::ImageFormat,_std::set<deqp::gls::FboUtil::FormatDB::ExtensionInfo,_std::less<deqp::gls::FboUtil::FormatDB::ExtensionInfo>,_std::allocator<deqp::gls::FboUtil::FormatDB::ExtensionInfo>_>_>_>_>
          ::find(&map->_M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(map->_M_t)._M_impl.super__Rb_tree_header) {
    return (mapped_type *)&cVar1._M_node[1]._M_parent;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"key not found in map");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const typename M::mapped_type& lookup (const M& map, const typename M::key_type& key)
{
	const typename M::mapped_type* ptr = tryLookup(map, key);
	if (ptr == DE_NULL)
		throw std::out_of_range("key not found in map");
	return *ptr;
}